

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O1

Cnf_Dat_t * Mf_ManDeriveCnf(Mf_Man_t *p,int fCnfObjIds,int fAddOrCla)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  int iVar3;
  Gia_Man_t *pGVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pAVar7;
  undefined8 uVar8;
  void *pvVar9;
  int *piVar10;
  Gia_Man_t *pGVar11;
  bool bVar12;
  Vec_Int_t *pVVar13;
  int *piVar14;
  Cnf_Dat_t *pCVar15;
  int **ppiVar16;
  int *piVar17;
  ulong uVar18;
  byte bVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  uint uVar23;
  char *pcVar24;
  long lVar25;
  long lVar26;
  ulong uVar27;
  char *pcVar28;
  long lVar29;
  ulong uVar30;
  char *pcVar31;
  long lVar32;
  long lVar33;
  ulong uVar34;
  Vec_Int_t *pVVar35;
  long lVar36;
  int *pArray;
  int iVar37;
  uint uVar38;
  size_t sVar39;
  int nLits;
  int nClas;
  int nVars;
  int pFanins [16];
  int local_c4;
  int local_c0;
  int local_bc;
  Cnf_Dat_t *local_b8;
  Vec_Int_t *local_b0;
  int *local_a8;
  long local_a0;
  int *local_98;
  Gia_Man_t *local_90;
  long local_88;
  long local_80;
  int aiStack_78 [18];
  
  pVVar13 = Mf_ManDeriveCnfs(p,&local_bc,&local_c0,&local_c4);
  pGVar4 = p->pGia;
  iVar37 = pGVar4->nObjs;
  lVar25 = (long)iVar37;
  local_a8 = (int *)malloc(0x10);
  iVar20 = 0x10;
  if (0xe < iVar37 - 1U) {
    iVar20 = iVar37;
  }
  local_a8[1] = 0;
  *local_a8 = iVar20;
  if (iVar20 == 0) {
    piVar14 = (int *)0x0;
  }
  else {
    piVar14 = (int *)malloc((long)iVar20 << 2);
  }
  *(int **)(local_a8 + 2) = piVar14;
  local_a8[1] = iVar37;
  memset(piVar14,0xff,lVar25 * 4);
  iVar20 = local_bc + 1;
  if (fAddOrCla != 0) {
    local_c0 = local_c0 + 1;
    local_c4 = local_c4 + *(int *)((long)&((Aig_Obj_t *)pGVar4->vCos)->field_0 + 4);
  }
  local_b0 = pVVar13;
  if (fCnfObjIds == 0) {
    pAVar5 = (Aig_Obj_t *)pGVar4->vCos;
    if (*(int *)((long)&pAVar5->field_0 + 4) < 1) {
      iVar21 = 1;
    }
    else {
      pAVar6 = pAVar5->pFanin0;
      lVar32 = 0;
      do {
        iVar21 = *(int *)((long)&pAVar6->field_0 + lVar32 * 4);
        if (((long)iVar21 < 0) || (pGVar4->nObjs <= iVar21)) goto LAB_00717a2c;
        if (iVar21 == 0) break;
        if (iVar37 <= iVar21) goto LAB_00717a6a;
        lVar32 = lVar32 + 1;
        piVar14[iVar21] = (int)lVar32;
      } while (lVar32 < *(int *)((long)&pAVar5->field_0 + 4));
      iVar21 = (int)lVar32 + 1;
    }
    lVar32 = (long)pGVar4->nObjs;
    if (1 < lVar32) {
      lVar26 = lVar32 << 4;
      lVar29 = lVar32 * 3;
      do {
        if (pGVar4->nObjs < lVar32) goto LAB_00717a2c;
        uVar23 = *(uint *)((long)pGVar4->pObjs + lVar29 * 4 + -0xc);
        if (((~uVar23 & 0x1fffffff) != 0 && -1 < (int)uVar23) &&
           (0xffff < *(uint *)((long)p->pLfObjs + lVar26 + -4))) {
          if (lVar25 < lVar32) goto LAB_00717a6a;
          piVar14[lVar32 + -1] = iVar21;
          iVar21 = iVar21 + 1;
        }
        lVar26 = lVar26 + -0x10;
        bVar12 = 2 < lVar32;
        lVar32 = lVar32 + -1;
        lVar29 = lVar29 + -3;
      } while (bVar12);
    }
    if (iVar37 < 1) goto LAB_00717a6a;
    *piVar14 = iVar21;
    pAVar5 = (Aig_Obj_t *)pGVar4->vCis;
    if (0 < *(int *)((long)&pAVar5->field_0 + 4)) {
      pAVar6 = pAVar5->pFanin0;
      lVar25 = 0;
      do {
        iVar2 = *(int *)((long)&pAVar6->field_0 + lVar25 * 4);
        if (((long)iVar2 < 0) || (pGVar4->nObjs <= iVar2)) goto LAB_00717a2c;
        if (iVar2 == 0) break;
        if (iVar37 <= iVar2) goto LAB_00717a6a;
        piVar14[iVar2] = iVar21 + (int)lVar25 + 1;
        lVar25 = lVar25 + 1;
      } while (lVar25 < *(int *)((long)&pAVar5->field_0 + 4));
      iVar21 = iVar21 + (int)lVar25;
    }
    if (iVar21 != local_bc) {
      local_bc = iVar20;
      __assert_fail("iVar == nVars",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaMf.c"
                    ,0x16c,"Cnf_Dat_t *Mf_ManDeriveCnf(Mf_Man_t *, int, int)");
    }
  }
  else {
    pAVar5 = (Aig_Obj_t *)pGVar4->vCis;
    pAVar6 = (Aig_Obj_t *)pGVar4->vCos;
    iVar21 = *(int *)((long)&pAVar5->field_0 + 4);
    iVar2 = *(int *)((long)&pAVar6->field_0 + 4);
    if (0 < iVar2) {
      pAVar7 = pAVar6->pFanin0;
      lVar32 = 0;
      do {
        iVar3 = *(int *)((long)&pAVar7->field_0 + lVar32 * 4);
        if (((long)iVar3 < 0) || (pGVar4->nObjs <= iVar3)) goto LAB_00717a2c;
        if (iVar3 == 0) break;
        if (iVar37 <= iVar3) goto LAB_00717a6a;
        piVar14[iVar3] = iVar3;
        lVar32 = lVar32 + 1;
      } while (lVar32 < *(int *)((long)&pAVar6->field_0 + 4));
    }
    iVar21 = iVar21 + iVar2 + 2;
    lVar32 = (long)pGVar4->nObjs;
    if (1 < lVar32) {
      lVar26 = lVar32 << 4;
      lVar29 = lVar32 * 3;
      do {
        if (pGVar4->nObjs < lVar32) goto LAB_00717a2c;
        uVar23 = *(uint *)((long)pGVar4->pObjs + lVar29 * 4 + -0xc);
        if (((~uVar23 & 0x1fffffff) != 0 && -1 < (int)uVar23) &&
           (0xffff < *(uint *)((long)p->pLfObjs + lVar26 + -4))) {
          if (lVar25 < lVar32) goto LAB_00717a6a;
          piVar14[lVar32 + -1] = (int)lVar32 + -1;
          iVar21 = iVar21 + 1;
        }
        lVar26 = lVar26 + -0x10;
        bVar12 = 2 < lVar32;
        lVar32 = lVar32 + -1;
        lVar29 = lVar29 + -3;
      } while (bVar12);
    }
    if (iVar37 < 1) {
LAB_00717a6a:
      local_bc = iVar20;
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    *piVar14 = 0;
    if (0 < *(int *)((long)&pAVar5->field_0 + 4)) {
      pAVar6 = pAVar5->pFanin0;
      lVar25 = 0;
      do {
        iVar2 = *(int *)((long)&pAVar6->field_0 + lVar25 * 4);
        if (((long)iVar2 < 0) || (pGVar4->nObjs <= iVar2)) goto LAB_00717a2c;
        if (iVar2 == 0) break;
        if (iVar37 <= iVar2) goto LAB_00717a6a;
        piVar14[iVar2] = iVar2;
        lVar25 = lVar25 + 1;
      } while (lVar25 < *(int *)((long)&pAVar5->field_0 + 4));
    }
    if (iVar21 != iVar20) {
      local_bc = iVar20;
      __assert_fail("iVar == nVars",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaMf.c"
                    ,0x160,"Cnf_Dat_t *Mf_ManDeriveCnf(Mf_Man_t *, int, int)");
    }
  }
  local_bc = iVar20;
  pCVar15 = (Cnf_Dat_t *)calloc(1,0x48);
  pCVar15->pMan = (Aig_Man_t *)pGVar4;
  pCVar15->nVars = iVar20;
  lVar25 = (long)local_c4;
  pCVar15->nLiterals = local_c4;
  local_a0 = (long)local_c0;
  pCVar15->nClauses = local_c0;
  ppiVar16 = (int **)malloc(local_a0 * 8 + 8);
  pCVar15->pClauses = ppiVar16;
  local_b8 = pCVar15;
  local_80 = lVar25;
  piVar17 = (int *)malloc(lVar25 << 2);
  pVVar13 = local_b0;
  uVar27 = 0;
  *ppiVar16 = piVar17;
  iVar20 = local_bc;
  if (fAddOrCla == 0) {
    lVar25 = 0;
  }
  else {
    pAVar5 = (Aig_Obj_t *)pGVar4->vCos;
    lVar25 = 1;
    if (0 < *(int *)((long)&pAVar5->field_0 + 4)) {
      pAVar6 = pAVar5->pFanin0;
      uVar27 = 0;
      do {
        iVar37 = *(int *)((long)&pAVar6->field_0 + uVar27 * 4);
        if (((long)iVar37 < 0) || (pGVar4->nObjs <= iVar37)) goto LAB_00717a2c;
        if (iVar37 == 0) break;
        if (piVar14[iVar37] < 0) goto LAB_00717a0d;
        piVar17[uVar27] = piVar14[iVar37] * 2;
        uVar27 = uVar27 + 1;
      } while ((long)uVar27 < (long)*(int *)((long)&pAVar5->field_0 + 4));
    }
  }
  pGVar4 = p->pGia;
  pVVar35 = pGVar4->vCos;
  if (0 < pVVar35->nSize) {
    uVar27 = uVar27 & 0xffffffff;
    lVar32 = lVar25 * 8;
    lVar26 = 0;
    lVar29 = 0;
    lVar33 = 0;
    do {
      iVar37 = *(int *)((long)pVVar35->pArray + lVar29);
      lVar36 = (long)iVar37;
      if ((lVar36 < 0) || (pGVar4->nObjs <= iVar37)) goto LAB_00717a2c;
      if (pGVar4->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar1 = pGVar4->pObjs + lVar36;
      uVar8 = *(undefined8 *)pGVar1;
      *(ulong *)((long)ppiVar16 + lVar29 * 4 + lVar32) = (long)*ppiVar16 + lVar26 + uVar27 * 4;
      if (piVar14[lVar36] < 0) goto LAB_00717a0d;
      iVar37 = iVar37 - ((uint)uVar8 & 0x1fffffff);
      piVar17 = *ppiVar16;
      piVar17[uVar27 + lVar29] = piVar14[lVar36] * 2;
      if (piVar14[iVar37] < 0) goto LAB_00717a0d;
      piVar17[uVar27 + lVar29 + 1] = (*(uint *)pGVar1 >> 0x1d & 1) + piVar14[iVar37] * 2 ^ 1;
      *(ulong *)((long)ppiVar16 + lVar29 * 4 + lVar32 + 8) = (long)piVar17 + lVar26 + uVar27 * 4 + 8
      ;
      if (piVar14[lVar36] < 0) goto LAB_00717a0d;
      piVar17[uVar27 + lVar29 + 2] = piVar14[lVar36] * 2 + 1;
      if (piVar14[iVar37] < 0) goto LAB_00717a0d;
      piVar17[uVar27 + lVar29 + 3] = (*(uint *)pGVar1 >> 0x1d & 1) + piVar14[iVar37] * 2;
      lVar33 = lVar33 + 1;
      pVVar35 = pGVar4->vCos;
      lVar29 = lVar29 + 4;
      lVar26 = lVar26 + 0x10;
      lVar25 = lVar25 + 2;
    } while (lVar33 < pVVar35->nSize);
    uVar27 = uVar27 + lVar29;
  }
  iVar37 = (int)lVar25;
  iVar21 = (int)uVar27;
  local_98 = piVar14;
  if (1 < (long)pGVar4->nObjs) {
    local_90 = p->pGia;
    lVar32 = (long)pGVar4->nObjs;
    do {
      if (local_90->nObjs < lVar32) goto LAB_00717a2c;
      lVar29 = lVar32 + -1;
      if ((~*(uint *)(local_90->pObjs + lVar29) & 0x1fffffff) != 0 &&
          -1 < (int)*(uint *)(local_90->pObjs + lVar29)) {
        if (0xffff < *(uint *)&p->pLfObjs[lVar29].field_0xc) {
          uVar23 = p->pLfObjs[lVar29].iCutSet;
          uVar22 = (int)uVar23 >> 0x10;
          if (((int)uVar22 < 0) || ((p->vPages).nSize <= (int)uVar22)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pvVar9 = (p->vPages).pArray[uVar22];
          uVar34 = (ulong)(uVar23 & 0xffff);
          uVar23 = *(uint *)((long)pvVar9 + uVar34 * 4 + 4);
          if ((uVar23 & 0x1f) == 0) {
            uVar18 = 0;
          }
          else {
            uVar30 = 0;
            do {
              uVar18 = uVar30 + 1;
              aiStack_78[uVar30] = piVar14[*(int *)((long)pvVar9 + uVar30 * 4 + uVar34 * 4 + 8)];
              uVar30 = uVar18;
            } while (((ulong)uVar23 & 0x1f) != uVar18);
          }
          aiStack_78[uVar18] = piVar14[lVar29];
          if (local_b0->nSize <= (int)(uVar23 >> 6)) goto LAB_00717aa8;
          piVar17 = local_b0->pArray;
          lVar26 = (long)piVar17[uVar23 >> 6];
          local_88 = lVar29;
          if ((lVar26 < 0) || (local_b0->nSize <= piVar17[uVar23 >> 6])) {
            pcVar31 = "i >= 0 && i < p->nSize";
            pcVar28 = 
            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
            ;
            pcVar24 = "int *Vec_IntEntryP(Vec_Int_t *, int)";
            goto LAB_00717a41;
          }
          iVar37 = piVar17[lVar26];
          if (0 < (long)iVar37) {
            lVar25 = (long)(int)lVar25;
            lVar33 = 0;
            do {
              iVar21 = (int)uVar27;
              ppiVar16[lVar25] = *ppiVar16 + iVar21;
              uVar22 = *(uint *)((long)pvVar9 + uVar34 * 4 + 4) & 0x1f;
              uVar38 = piVar17[lVar26 + lVar33 + 1] >> ((char)uVar22 * '\x02' & 0x1fU) & 3;
              if (uVar38 == 0) {
                pcVar31 = "Mf_CubeLit(pCubes[c], k)";
                pcVar28 = 
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaMf.c"
                ;
                pcVar24 = "Cnf_Dat_t *Mf_ManDeriveCnf(Mf_Man_t *, int, int)";
                goto LAB_00717a60;
              }
              if (aiStack_78[uVar22] < 0) goto LAB_00717a0d;
              piVar10 = *ppiVar16;
              uVar27 = (ulong)(iVar21 + 1);
              piVar10[iVar21] = ((uint)(uVar38 == 2) ^ uVar23 >> 5 & 1) + aiStack_78[uVar22] * 2;
              if ((*(byte *)((long)pvVar9 + uVar34 * 4 + 4) & 0x1f) != 0) {
                bVar19 = 0;
                uVar18 = 0;
                do {
                  uVar22 = piVar17[lVar26 + lVar33 + 1] >> (bVar19 & 0x1f) & 3;
                  if (uVar22 != 0) {
                    if (aiStack_78[uVar18] < 0) goto LAB_00717a0d;
                    iVar21 = (int)uVar27;
                    uVar27 = (ulong)(iVar21 + 1);
                    piVar10[iVar21] = (uint)(uVar22 == 2) + aiStack_78[uVar18] * 2;
                  }
                  uVar18 = uVar18 + 1;
                  bVar19 = bVar19 + 2;
                } while (uVar18 < (*(uint *)((long)pvVar9 + uVar34 * 4 + 4) & 0x1f));
              }
              lVar25 = lVar25 + 1;
              lVar33 = lVar33 + 1;
            } while (lVar33 != iVar37);
          }
        }
      }
      iVar37 = (int)lVar25;
      iVar21 = (int)uVar27;
      bVar12 = 2 < lVar32;
      lVar32 = lVar29;
    } while (bVar12);
  }
  ppiVar16[iVar37] = *ppiVar16 + iVar21;
  if (*piVar14 < 0) {
LAB_00717a0d:
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                  ,0xf1,"int Abc_Var2Lit(int, int)");
  }
  piVar17 = *ppiVar16;
  piVar17[iVar21] = *piVar14 * 2 + 1;
  if (iVar37 + 1 != (int)local_a0) {
    __assert_fail("iCla == nClas",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaMf.c"
                  ,0x1a8,"Cnf_Dat_t *Mf_ManDeriveCnf(Mf_Man_t *, int, int)");
  }
  if (iVar21 + 1 != (int)local_80) {
    __assert_fail("iLit == nLits",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaMf.c"
                  ,0x1a9,"Cnf_Dat_t *Mf_ManDeriveCnf(Mf_Man_t *, int, int)");
  }
  ppiVar16[iVar37 + 1] = piVar17 + (iVar21 + 1);
  if (local_b0->pArray != (int *)0x0) {
    free(local_b0->pArray);
    pVVar13->pArray = (int *)0x0;
  }
  if (pVVar13 != (Vec_Int_t *)0x0) {
    free(pVVar13);
  }
  pGVar4 = p->pGia;
  if (fCnfObjIds == 0) {
    pGVar11 = p->pGia0;
    if (pGVar4 == pGVar11) {
      local_a8[0] = 0;
      local_a8[1] = 0;
      local_a8[2] = 0;
      local_a8[3] = 0;
      local_b8->pVarNums = piVar14;
    }
    else {
      sVar39 = (long)pGVar11->nObjs << 2;
      piVar17 = (int *)malloc(sVar39);
      piVar14 = local_98;
      memset(piVar17,0xff,sVar39);
      local_b8->pVarNums = piVar17;
      pVVar13 = pGVar11->vCis;
      iVar20 = local_bc;
      if (0 < pVVar13->nSize) {
        piVar10 = pVVar13->pArray;
        lVar25 = 0;
        do {
          iVar37 = piVar10[lVar25];
          if (((long)iVar37 < 0) || (pGVar11->nObjs <= iVar37)) goto LAB_00717a2c;
          if (iVar37 == 0) break;
          if (pGVar4->vCis->nSize <= lVar25) goto LAB_00717aa8;
          iVar21 = pGVar4->vCis->pArray[lVar25];
          if (((long)iVar21 < 0) || (pGVar4->nObjs <= iVar21)) goto LAB_00717a2c;
          piVar17[iVar37] = piVar14[iVar21];
          lVar25 = lVar25 + 1;
        } while (lVar25 < pVVar13->nSize);
      }
      pVVar13 = pGVar11->vCos;
      if (0 < pVVar13->nSize) {
        piVar10 = pVVar13->pArray;
        lVar25 = 0;
LAB_00717963:
        iVar37 = piVar10[lVar25];
        if (((long)iVar37 < 0) || (pGVar11->nObjs <= iVar37)) {
LAB_00717a2c:
          local_bc = iVar20;
          pcVar31 = "v >= 0 && v < p->nObjs";
          pcVar28 = 
          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
          ;
          pcVar24 = "Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)";
LAB_00717a41:
          __assert_fail(pcVar31,pcVar28,0x1af,pcVar24);
        }
        if (iVar37 != 0) {
          if (pGVar4->vCos->nSize <= lVar25) {
LAB_00717aa8:
            pcVar31 = "i >= 0 && i < p->nSize";
            pcVar28 = 
            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
            ;
            pcVar24 = "int Vec_IntEntry(Vec_Int_t *, int)";
LAB_00717a60:
            __assert_fail(pcVar31,pcVar28,0x19e,pcVar24);
          }
          iVar21 = pGVar4->vCos->pArray[lVar25];
          if (((long)iVar21 < 0) || (pGVar4->nObjs <= iVar21)) goto LAB_00717a2c;
          piVar17[iVar37] = piVar14[iVar21];
          lVar25 = lVar25 + 1;
          if (lVar25 < pVVar13->nSize) goto LAB_00717963;
        }
      }
    }
  }
  else {
    sVar39 = (long)pGVar4->nObjs << 2;
    piVar14 = (int *)malloc(sVar39);
    memset(piVar14,0xff,sVar39);
    pCVar15 = local_b8;
    local_b8->pObj2Clause = piVar14;
    sVar39 = (long)pGVar4->nObjs << 2;
    piVar17 = (int *)malloc(sVar39);
    memset(piVar17,0xff,sVar39);
    pCVar15->pObj2Count = piVar17;
    if (0 < (int)local_a0) {
      lVar25 = 0;
      do {
        if (*ppiVar16[lVar25] < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                        ,0xf2,"int Abc_Lit2Var(int)");
        }
        uVar23 = (uint)*ppiVar16[lVar25] >> 1;
        if (piVar14[uVar23] == -1) {
          piVar14[uVar23] = (int)lVar25;
          piVar17[uVar23] = 1;
        }
        else {
          if (piVar17[uVar23] < 1) {
            __assert_fail("pCnf->pObj2Count[Id] > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaMf.c"
                          ,0x1bd,"Cnf_Dat_t *Mf_ManDeriveCnf(Mf_Man_t *, int, int)");
          }
          piVar17[uVar23] = piVar17[uVar23] + 1;
        }
        lVar25 = lVar25 + 1;
      } while (local_a0 != lVar25);
    }
  }
  piVar14 = local_a8;
  if (*(void **)(local_a8 + 2) != (void *)0x0) {
    free(*(void **)(local_a8 + 2));
    piVar14[2] = 0;
    piVar14[3] = 0;
  }
  free(piVar14);
  return local_b8;
}

Assistant:

Cnf_Dat_t * Mf_ManDeriveCnf( Mf_Man_t * p, int fCnfObjIds, int fAddOrCla )
{
    Cnf_Dat_t * pCnf; 
    Gia_Obj_t * pObj;
    int Id, DriId, nVars, nClas, nLits, iVar = 1, iCla = 0, iLit = 0;
    Vec_Int_t * vCnfs = Mf_ManDeriveCnfs( p, &nVars, &nClas, &nLits );
    Vec_Int_t * vCnfIds = Vec_IntStartFull( Gia_ManObjNum(p->pGia) );
    int pFanins[16], * pCut, * pCnfIds = Vec_IntArray( vCnfIds );
    int i, k, c, iFunc, nCubes, * pCubes, fComplLast;
    nVars++;  // zero-ID to remain unused
    if ( fAddOrCla )
    {
        nClas++;
        nLits += Gia_ManCoNum(p->pGia);
    }
    // create CNF IDs
    if ( fCnfObjIds )
    {
        iVar += 1 + Gia_ManCiNum(p->pGia) + Gia_ManCoNum(p->pGia);
        Gia_ManForEachCoId( p->pGia, Id, i )
            Vec_IntWriteEntry( vCnfIds, Id, Id );
        Gia_ManForEachAndReverseId( p->pGia, Id )
            if ( Mf_ObjMapRefNum(p, Id) )
                Vec_IntWriteEntry( vCnfIds, Id, Id ), iVar++;
        Vec_IntWriteEntry( vCnfIds, 0, 0 );
        Gia_ManForEachCiId( p->pGia, Id, i )
            Vec_IntWriteEntry( vCnfIds, Id, Id );
        assert( iVar == nVars );
    }
    else
    {
        Gia_ManForEachCoId( p->pGia, Id, i )
            Vec_IntWriteEntry( vCnfIds, Id, iVar++ );
        Gia_ManForEachAndReverseId( p->pGia, Id )
            if ( Mf_ObjMapRefNum(p, Id) )
                Vec_IntWriteEntry( vCnfIds, Id, iVar++ );
        Vec_IntWriteEntry( vCnfIds, 0, iVar++ );
        Gia_ManForEachCiId( p->pGia, Id, i )
            Vec_IntWriteEntry( vCnfIds, Id, iVar++ );
        assert( iVar == nVars );
    }
    // generate CNF
    pCnf = ABC_CALLOC( Cnf_Dat_t, 1 );
    pCnf->pMan        = (Aig_Man_t *)p->pGia;
    pCnf->nVars       = nVars;
    pCnf->nLiterals   = nLits;
    pCnf->nClauses    = nClas;
    pCnf->pClauses    = ABC_ALLOC( int *, nClas+1 );
    pCnf->pClauses[0] = ABC_ALLOC( int, nLits );
    // add last clause
    if ( fAddOrCla )
    {
        pCnf->pClauses[iCla++] = pCnf->pClauses[0] + iLit;
        Gia_ManForEachCoId( p->pGia, Id, i )
            pCnf->pClauses[0][iLit++] = Abc_Var2Lit(pCnfIds[Id], 0);
    }
    // add clauses for the COs
    Gia_ManForEachCo( p->pGia, pObj, i )
    {
        Id = Gia_ObjId( p->pGia, pObj );
        DriId = Gia_ObjFaninId0( pObj, Id );

        pCnf->pClauses[iCla++] = pCnf->pClauses[0] + iLit;
        pCnf->pClauses[0][iLit++] = Abc_Var2Lit(pCnfIds[Id], 0);
        pCnf->pClauses[0][iLit++] = Abc_Var2Lit(pCnfIds[DriId], !Gia_ObjFaninC0(pObj));

        pCnf->pClauses[iCla++] = pCnf->pClauses[0] + iLit;
        pCnf->pClauses[0][iLit++] = Abc_Var2Lit(pCnfIds[Id], 1);
        pCnf->pClauses[0][iLit++] = Abc_Var2Lit(pCnfIds[DriId], Gia_ObjFaninC0(pObj));
    }
    // add clauses for the mapping
    Gia_ManForEachAndReverseId( p->pGia, Id )
    {
        if ( !Mf_ObjMapRefNum(p, Id) )
            continue;
        pCut = Mf_ObjCutBest( p, Id );
        iFunc = Abc_Lit2Var( Mf_CutFunc(pCut) );
        //Dau_DsdPrintFromTruth( Vec_MemReadEntry(p->vTtMem, iFunc), 3 );
        fComplLast = Abc_LitIsCompl( Mf_CutFunc(pCut) );
        for ( k = 0; k < Mf_CutSize(pCut); k++ )
            pFanins[k] = pCnfIds[pCut[k+1]];
        pFanins[k++] = pCnfIds[Id];
        // get clauses
        pCubes = Vec_IntEntryP( vCnfs, Vec_IntEntry(vCnfs, iFunc) );
        nCubes = *pCubes++;
        for ( c = 0; c < nCubes; c++ )
        {
            pCnf->pClauses[iCla++] = pCnf->pClauses[0] + iLit;
            k = Mf_CutSize(pCut);
            assert( Mf_CubeLit(pCubes[c], k) );
            pCnf->pClauses[0][iLit++] = Abc_Var2Lit( pFanins[k], (Mf_CubeLit(pCubes[c], k) == 2) ^ fComplLast );
            for ( k = 0; k < Mf_CutSize(pCut); k++ )
                if ( Mf_CubeLit(pCubes[c], k) )
                    pCnf->pClauses[0][iLit++] = Abc_Var2Lit( pFanins[k], Mf_CubeLit(pCubes[c], k) == 2 );
        }
    }
    // constant clause
    pCnf->pClauses[iCla++] = pCnf->pClauses[0] + iLit;
    pCnf->pClauses[0][iLit++] = Abc_Var2Lit(pCnfIds[0], 1);
    assert( iCla == nClas );
    assert( iLit == nLits );
    // add closing pointer
    pCnf->pClauses[iCla++] = pCnf->pClauses[0] + iLit;
    // cleanup
    Vec_IntFree( vCnfs );
    // create mapping of objects into their clauses
    if ( fCnfObjIds )
    {
        pCnf->pObj2Clause = ABC_FALLOC( int, Gia_ManObjNum(p->pGia) );
        pCnf->pObj2Count  = ABC_FALLOC( int, Gia_ManObjNum(p->pGia) );
        for ( i = 0; i < pCnf->nClauses; i++ )
        {
            Id = Abc_Lit2Var(pCnf->pClauses[i][0]);
            if ( pCnf->pObj2Clause[Id] == -1 )
            {
                pCnf->pObj2Clause[Id] = i;
                pCnf->pObj2Count[Id] = 1;
            }
            else
            {
                assert( pCnf->pObj2Count[Id] > 0 );
                pCnf->pObj2Count[Id]++;
            }
        }
    }
    else
    {
        if ( p->pGia != p->pGia0 ) // diff managers - create map for CIs/COs
        {
            pCnf->pVarNums = ABC_FALLOC( int, Gia_ManObjNum(p->pGia0) );
            Gia_ManForEachCiId( p->pGia0, Id, i )
                pCnf->pVarNums[Id] = pCnfIds[Gia_ManCiIdToId(p->pGia, i)];
            Gia_ManForEachCoId( p->pGia0, Id, i )
                pCnf->pVarNums[Id] = pCnfIds[Gia_ManCoIdToId(p->pGia, i)];
/*
            // transform polarity of the internal nodes
            Gia_ManSetPhase( p->pGia );
            Gia_ManForEachCo( p->pGia, pObj, i )
                pObj->fPhase = 0;
            for ( i = 0; i < pCnf->nLiterals; i++ )
                if ( Gia_ManObj(p->pGia, Abc_Lit2Var(pCnf->pClauses[0][i]))->fPhase )
                    pCnf->pClauses[0][i] = Abc_LitNot( pCnf->pClauses[0][i] );
*/
        }
        else
            pCnf->pVarNums = Vec_IntReleaseArray(vCnfIds);
    }
    Vec_IntFree( vCnfIds );
    return pCnf;
}